

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O3

void __thiscall FC_BPNN::~FC_BPNN(FC_BPNN *this)

{
  Preceptron *this_00;
  _Base_ptr p_Var1;
  pointer pmVar2;
  pointer pmVar3;
  ulong uVar4;
  ulong uVar5;
  _Rb_tree_header *p_Var6;
  
  pmVar2 = (this->net).
           super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar3 = (this->net).
           super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar3 != pmVar2) {
    uVar5 = 0;
    do {
      p_Var6 = &pmVar2[uVar5]._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = pmVar2[uVar5]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var1 != p_Var6) {
        do {
          this_00 = (Preceptron *)p_Var1[1]._M_parent;
          if (this_00 != (Preceptron *)0x0) {
            Preceptron::~Preceptron(this_00);
          }
          operator_delete(this_00,0x98);
          p_Var1[1]._M_parent = (_Base_ptr)0x0;
          p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
        } while ((_Rb_tree_header *)p_Var1 != p_Var6);
        pmVar2 = (this->net).
                 super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pmVar3 = (this->net).
                 super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
      uVar4 = ((long)pmVar3 - (long)pmVar2 >> 4) * -0x5555555555555555;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  std::
  vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ::~vector(&this->net);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_error);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_value);
  return;
}

Assistant:

FC_BPNN::~FC_BPNN()
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			delete element.second;
			element.second = nullptr;
		}
	}
}